

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tremove(lua_State *L)

{
  lua_Integer def;
  lua_Integer n;
  
  checktab(L,1,7);
  def = luaL_len(L,1);
  n = luaL_optinteger(L,2,def);
  if ((n != def) && (def + 1 < n || n < 1)) {
    luaL_argerror(L,1,"position out of bounds");
  }
  lua_geti(L,1,n);
  while (n < def) {
    lua_geti(L,1,n + 1);
    lua_seti(L,1,n);
    n = n + 1;
  }
  lua_pushnil(L);
  lua_seti(L,1,n);
  return 1;
}

Assistant:

static int tremove (lua_State *L) {
  lua_Integer size = aux_getn(L, 1, TAB_RW);
  lua_Integer pos = luaL_optinteger(L, 2, size);
  if (pos != size)  /* validate 'pos' if given */
    /* check whether 'pos' is in [1, size + 1] */
    luaL_argcheck(L, (lua_Unsigned)pos - 1u <= (lua_Unsigned)size, 1,
                     "position out of bounds");
  lua_geti(L, 1, pos);  /* result = t[pos] */
  for ( ; pos < size; pos++) {
    lua_geti(L, 1, pos + 1);
    lua_seti(L, 1, pos);  /* t[pos] = t[pos + 1] */
  }
  lua_pushnil(L);
  lua_seti(L, 1, pos);  /* remove entry t[pos] */
  return 1;
}